

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterStartDTD(xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid)

{
  xmlParserErrors error;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  xmlLinkPtr lk;
  void *pvVar8;
  undefined8 *data;
  xmlChar *pxVar9;
  char *pcVar10;
  
  if (name == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  if (*name == '\0') {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  if ((lk == (xmlLinkPtr)0x0) || (pvVar8 = xmlLinkGetData(lk), pvVar8 == (void *)0x0)) {
    data = (undefined8 *)(*xmlMalloc)(0x10);
    if (data == (undefined8 *)0x0) {
      pcVar10 = "xmlTextWriterStartDTD : out of memory!\n";
      error = XML_ERR_NO_MEMORY;
      goto LAB_001adcef;
    }
    pxVar9 = xmlStrdup(name);
    *data = pxVar9;
    if (pxVar9 == (xmlChar *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTD : out of memory!\n");
      (*xmlFree)(data);
      return -1;
    }
    *(undefined4 *)(data + 1) = 7;
    xmlListPushFront(writer->nodes,data);
    iVar1 = xmlOutputBufferWriteString(writer->out,"<!DOCTYPE ");
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
    if (iVar2 < 0) {
      return -1;
    }
    iVar2 = iVar2 + iVar1;
    if (pubid == (xmlChar *)0x0) {
      if (sysid == (xmlChar *)0x0) {
        return iVar2;
      }
      pcVar10 = "\n";
      if (writer->indent == 0) {
        pcVar10 = " ";
      }
      iVar1 = xmlOutputBufferWrite(writer->out,1,pcVar10);
      if (iVar1 < 0) {
        return -1;
      }
      iVar7 = xmlOutputBufferWriteString(writer->out,"SYSTEM ");
      if (iVar7 < 0) {
        return -1;
      }
      iVar1 = iVar1 + iVar2;
LAB_001addad:
      iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar2 < 0) {
        return -1;
      }
      iVar3 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
      if (iVar3 < 0) {
        return -1;
      }
      iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar4 < 0) {
        return -1;
      }
      return iVar3 + iVar4 + iVar2 + iVar1 + iVar7;
    }
    if (sysid != (xmlChar *)0x0) {
      pcVar10 = "\n";
      if (writer->indent == 0) {
        pcVar10 = " ";
      }
      iVar1 = xmlOutputBufferWrite(writer->out,1,pcVar10);
      if (iVar1 < 0) {
        return -1;
      }
      iVar3 = xmlOutputBufferWriteString(writer->out,"PUBLIC ");
      if (iVar3 < 0) {
        return -1;
      }
      iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar4 < 0) {
        return -1;
      }
      iVar5 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
      if (iVar5 < 0) {
        return -1;
      }
      iVar6 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
      if (iVar6 < 0) {
        return -1;
      }
      if (writer->indent == 0) {
        iVar7 = xmlOutputBufferWrite(writer->out,1," ");
      }
      else {
        iVar7 = xmlOutputBufferWriteString(writer->out,"\n       ");
      }
      if (iVar7 < 0) {
        return -1;
      }
      iVar1 = iVar3 + iVar4 + iVar5 + iVar6 + iVar1 + iVar2;
      goto LAB_001addad;
    }
    pcVar10 = "xmlTextWriterStartDTD : system identifier needed!\n";
  }
  else {
    pcVar10 = "xmlTextWriterStartDTD : DTD allowed only in prolog!\n";
  }
  error = XML_ERR_INTERNAL_ERROR;
LAB_001adcef:
  xmlWriterErrMsg(writer,error,pcVar10);
  return -1;
}

Assistant:

int
xmlTextWriterStartDTD(xmlTextWriterPtr writer,
                      const xmlChar * name,
                      const xmlChar * pubid, const xmlChar * sysid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if ((lk != NULL) && (xmlLinkGetData(lk) != NULL)) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartDTD : DTD allowed only in prolog!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTD : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_DTD;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<!DOCTYPE ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    if (pubid != 0) {
        if (sysid == 0) {
            xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                            "xmlTextWriterStartDTD : system identifier needed!\n");
            return -1;
        }

        if (writer->indent)
            count = xmlOutputBufferWrite(writer->out, 1, "\n");
        else
            count = xmlOutputBufferWrite(writer->out, 1, " ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWriteString(writer->out, "PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            if (writer->indent)
                count = xmlOutputBufferWrite(writer->out, 1, "\n");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
            count = xmlOutputBufferWriteString(writer->out, "SYSTEM ");
            if (count < 0)
                return -1;
            sum += count;
        } else {
			if (writer->indent)
            count = xmlOutputBufferWriteString(writer->out, "\n       ");
            else
                count = xmlOutputBufferWrite(writer->out, 1, " ");
            if (count < 0)
                return -1;
            sum += count;
        }

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;

        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;

        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}